

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

void __thiscall EventDispatcherTests::Run(EventDispatcherTests *this)

{
  anon_class_8_1_8991fb9c local_2a0;
  function<void_()> local_298;
  allocator local_271;
  string local_270 [32];
  anon_class_8_1_8991fb9c local_250;
  function<void_()> local_248;
  allocator local_221;
  string local_220 [32];
  anon_class_8_1_8991fb9c local_200;
  function<void_()> local_1f8;
  allocator local_1d1;
  string local_1d0 [32];
  anon_class_8_1_8991fb9c local_1b0;
  function<void_()> local_1a8;
  allocator local_181;
  string local_180 [32];
  anon_class_8_1_8991fb9c local_160;
  function<void_()> local_158;
  allocator local_131;
  string local_130 [32];
  anon_class_8_1_8991fb9c local_110;
  function<void_()> local_108;
  allocator local_e1;
  string local_e0 [32];
  anon_class_8_1_8991fb9c local_c0;
  function<void_()> local_b8;
  allocator local_91;
  string local_90 [32];
  anon_class_8_1_8991fb9c local_70;
  function<void_()> local_68;
  allocator local_31;
  string local_30 [32];
  EventDispatcherTests *local_10;
  EventDispatcherTests *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"event dispatcher with attached handlers",&local_31);
  local_70.this = this;
  std::function<void()>::function<EventDispatcherTests::Run()::_lambda()_1_,void>
            ((function<void()> *)&local_68,&local_70);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[4])
            (this,local_30,&local_68);
  std::function<void_()>::~function(&local_68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"dispatching an event that has no related handlers is valid",&local_91);
  local_c0.this = this;
  std::function<void()>::function<EventDispatcherTests::Run()::_lambda()_2_,void>
            ((function<void()> *)&local_b8,&local_c0);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_90,&local_b8);
  std::function<void_()>::~function(&local_b8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,"dispatching an event that has multiple related handlers",&local_e1);
  local_110.this = this;
  std::function<void()>::function<EventDispatcherTests::Run()::_lambda()_3_,void>
            ((function<void()> *)&local_108,&local_110);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_e0,&local_108);
  std::function<void_()>::~function(&local_108);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"the expected handlers were called",&local_131);
  local_160.this = this;
  std::function<void()>::function<EventDispatcherTests::Run()::_lambda()_4_,void>
            ((function<void()> *)&local_158,&local_160);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_130,&local_158);
  std::function<void_()>::~function(&local_158);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,
             "removing and handler and dispatching an event that had that related handlers",
             &local_181);
  local_1b0.this = this;
  std::function<void()>::function<EventDispatcherTests::Run()::_lambda()_5_,void>
            ((function<void()> *)&local_1a8,&local_1b0);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_180,&local_1a8);
  std::function<void_()>::~function(&local_1a8);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"the removed handler was not called",&local_1d1);
  local_200.this = this;
  std::function<void()>::function<EventDispatcherTests::Run()::_lambda()_6_,void>
            ((function<void()> *)&local_1f8,&local_200);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_1d0,&local_1f8);
  std::function<void_()>::~function(&local_1f8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,
             "adding a handler where the handler deconstructs before the event is dispatched",
             &local_221);
  local_250.this = this;
  std::function<void()>::function<EventDispatcherTests::Run()::_lambda()_7_,void>
            ((function<void()> *)&local_248,&local_250);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_220,&local_248);
  std::function<void_()>::~function(&local_248);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"the handler was not called",&local_271);
  local_2a0.this = this;
  std::function<void()>::function<EventDispatcherTests::Run()::_lambda()_8_,void>
            ((function<void()> *)&local_298,&local_2a0);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_270,&local_298);
  std::function<void_()>::~function(&local_298);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  return;
}

Assistant:

virtual void Run()
	{
		Given("event dispatcher with attached handlers", [&]()
		{
			m_eventHandler[0] = ed::EventDispatcherHandler();
			m_eventHandler[1] = ed::EventDispatcherHandler();

			m_mockTestEvent1Handler[0] = ut11::Mock<void(TestEvent<1>)>();
			m_mockTestEvent1Handler[1] = ut11::Mock<void(TestEvent<1>)>();

			m_eventDispatcher = std::unique_ptr<ed::EventDispatcher>(new ed::EventDispatcher());
	
			m_eventHandler[0] = m_eventDispatcher->addHandler(std::function<void(TestEvent<1>)>(std::ref(m_mockTestEvent1Handler[0])));
			m_eventHandler[1] = m_eventDispatcher->addHandler(std::function<void(TestEvent<1>)>(std::ref(m_mockTestEvent1Handler[1])));
		});
		Then("dispatching an event that has no related handlers is valid", [&]()
		{
			m_eventDispatcher->dispatch(TestEvent<2>(m_expectedValue));
		});
		When("dispatching an event that has multiple related handlers", [&]()
		{
			m_expectedValue = 5;

			m_eventDispatcher->dispatch(TestEvent<1>(m_expectedValue));
		});
		Then("the expected handlers were called", [&]()
		{
			MockVerifyTimes(1, m_mockTestEvent1Handler[0])(TestEvent<1>(m_expectedValue));
			MockVerifyTimes(1, m_mockTestEvent1Handler[1])(TestEvent<1>(m_expectedValue));
		});
		When("removing and handler and dispatching an event that had that related handlers", [&]()
		{
			m_eventHandler[0] = ed::EventDispatcherHandler();

			m_expectedValue = 5;

			m_eventDispatcher->dispatch(TestEvent<1>(m_expectedValue));
		});
		Then("the removed handler was not called", [&]()
		{
			MockVerifyTimes(0, m_mockTestEvent1Handler[0])(ut11::Is::Any<TestEvent<1>>());
			MockVerifyTimes(1, m_mockTestEvent1Handler[1])(TestEvent<1>(m_expectedValue));
		});
		When("adding a handler where the handler deconstructs before the event is dispatched", [&]()
		{
			m_eventHandler[0] = ed::EventDispatcherHandler();
			{ auto otherHandler = m_eventDispatcher->addHandler(std::function<void(TestEvent<1>)>(std::ref(m_mockTestEvent1Handler[0]))); }

			m_expectedValue = 5;

			m_eventDispatcher->dispatch(TestEvent<1>(m_expectedValue));
		});
		Then("the handler was not called", [&]()
		{
			MockVerifyTimes(0, m_mockTestEvent1Handler[0])(ut11::Is::Any<TestEvent<1>>());
			MockVerifyTimes(1, m_mockTestEvent1Handler[1])(TestEvent<1>(m_expectedValue));
		});
	}